

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void help(void)

{
  fprintf(_stderr,"-F [filename] Aggregate Full Uncertainty\n");
  fprintf(_stderr,"-W [filename] Aggregate Wheatsheaf\n");
  fprintf(_stderr,"-S [filename] Aggregate sample mean\n");
  fprintf(_stderr,"-M [filename] Aggregate Wheatsheaf mean\n");
  fprintf(_stderr,"-f [filename] Occurrence Full Uncertainty\n");
  fprintf(_stderr,"-w [filename] Occurrence Wheatsheaf\n");
  fprintf(_stderr,"-s [filename] Occurrence sample mean\n");
  fprintf(_stderr,"-m [filename] Occurrence Wheatsheaf mean\n");
  fprintf(_stderr,"-K [directory] workspace sub folder\n");
  fprintf(_stderr,"-r use return period file\n");
  fprintf(_stderr,"-H Skip header\n");
  fprintf(_stderr,"-h help\n");
  fprintf(_stderr,"-v version\n");
  return;
}

Assistant:

void help()
{
	fprintf(stderr, "-F [filename] Aggregate Full Uncertainty\n");
	fprintf(stderr, "-W [filename] Aggregate Wheatsheaf\n");
	fprintf(stderr, "-S [filename] Aggregate sample mean\n");
	fprintf(stderr, "-M [filename] Aggregate Wheatsheaf mean\n");
	fprintf(stderr, "-f [filename] Occurrence Full Uncertainty\n");
	fprintf(stderr, "-w [filename] Occurrence Wheatsheaf\n");
	fprintf(stderr, "-s [filename] Occurrence sample mean\n");
	fprintf(stderr, "-m [filename] Occurrence Wheatsheaf mean\n");
	fprintf(stderr, "-K [directory] workspace sub folder\n");
	fprintf(stderr, "-r use return period file\n");
	fprintf(stderr, "-H Skip header\n");
	fprintf(stderr, "-h help\n");
	fprintf(stderr, "-v version\n");
}